

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

__pid_t __thiscall
kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
          (Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *this,
          void *__stat_loc)

{
  SourceLocation location;
  WaitScope *in_RDX;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  ExceptionOrValue local_1b0;
  char local_18;
  PromiseNode *local_10;
  
  local_1b0.exception.ptr.isSet = false;
  local_18 = '\0';
  location.function = (char *)in_stack_00000010;
  location.fileName = (char *)in_stack_00000008;
  location._16_8_ = in_stack_00000018;
  kj::_::waitImpl((OwnPromiseNode *)__stat_loc,&local_1b0,in_RDX,location);
  if (local_18 == '\x01') {
    if (local_1b0.exception.ptr.isSet != false) {
      throwRecoverableException(&local_1b0.exception.ptr.field_1.value,0);
    }
    (this->super_PromiseBase).node.ptr = local_10;
    local_10 = (PromiseNode *)0x0;
    if (local_1b0.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1b0.exception.ptr.field_1.value);
    }
    return (__pid_t)this;
  }
  if (local_1b0.exception.ptr.isSet != false) {
    throwFatalException(&local_1b0.exception.ptr.field_1.value,0);
  }
  kj::_::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope, SourceLocation location) {
  _::ExceptionOr<_::FixVoid<T>> result;
  _::waitImpl(kj::mv(node), result, waitScope, location);
  return convertToReturn(kj::mv(result));
}